

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

bool __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::Iterator::operator==
          (Iterator *this,Iterator *other)

{
  TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *pTVar1;
  bool bVar2;
  bool bVar3;
  
  pTVar1 = this->parent;
  bVar3 = true;
  bVar2 = true;
  if (pTVar1 != (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)0x0) {
    bVar2 = (pTVar1->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pTVar1->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  }
  pTVar1 = other->parent;
  if (pTVar1 != (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)0x0) {
    bVar3 = (pTVar1->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pTVar1->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  }
  return (bool)(bVar2 ^ bVar3 ^ 1);
}

Assistant:

bool isEnd() const { return !parent || parent->workStack.empty(); }